

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

void anon_unknown.dwarf_1c2c8c::DirectorySearch(char *path,char *ext,vector<std::string> *results)

{
  pointer pbVar1;
  char *pcVar2;
  pointer pbVar3;
  long lVar4;
  int iVar5;
  DIR *__dirp;
  long lVar6;
  size_t sVar7;
  dirent *pdVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  _GLOBAL__N_1 *this;
  
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Searching %s for *%s\n",path,ext);
  }
  __dirp = opendir(path);
  if (__dirp != (DIR *)0x0) {
    lVar11 = (long)(results->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(results->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = lVar11 >> 5;
    sVar7 = strlen(ext);
    do {
      pdVar8 = readdir(__dirp);
      if (pdVar8 == (dirent *)0x0) break;
      pcVar2 = pdVar8->d_name;
      iVar5 = strcmp(pcVar2,".");
      if ((((iVar5 != 0) && (iVar5 = strcmp(pcVar2,".."), iVar5 != 0)) &&
          (sVar9 = strlen(pcVar2), sVar7 < sVar9)) &&
         (iVar5 = al::strcasecmp(pcVar2 + (sVar9 - sVar7),ext), iVar5 == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::emplace_back<>(results);
        pbVar1 = (results->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = pbVar1 + -1;
        pcVar2 = (char *)pbVar1[-1]._M_string_length;
        strlen(path);
        std::__cxx11::string::_M_replace((ulong)pbVar3,0,pcVar2,(ulong)path);
        if (pbVar1[-1]._M_dataplus._M_p[pbVar1[-1]._M_string_length - 1] != '/') {
          std::__cxx11::string::push_back((char)pbVar3);
        }
        std::__cxx11::string::append((char *)pbVar3);
      }
    } while (pdVar8 != (dirent *)0x0);
    closedir(__dirp);
    pbVar3 = (results->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this = (_GLOBAL__N_1 *)(lVar11 + (long)pbVar3);
    lVar11 = (long)(results->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
    uVar10 = lVar11 - lVar6;
    if (uVar10 != 0) {
      lVar4 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (this,this + (lVar11 - lVar6) * 0x20,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_less_iter>
                (this,this + (lVar11 - lVar6) * 0x20);
    }
    if (lVar11 != lVar6) {
      lVar6 = lVar11 * 0x20 + lVar6 * -0x20;
      do {
        if (2 < (int)gLogLevel) {
          _GLOBAL__N_1::DirectorySearch(this);
        }
        this = this + 0x20;
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void DirectorySearch(const char *path, const char *ext, al::vector<std::string> *const results)
{
    TRACE("Searching %s for *%s\n", path, ext);
    DIR *dir{opendir(path)};
    if(!dir) return;

    const auto base = results->size();
    const size_t extlen{strlen(ext)};

    while(struct dirent *dirent{readdir(dir)})
    {
        if(strcmp(dirent->d_name, ".") == 0 || strcmp(dirent->d_name, "..") == 0)
            continue;

        const size_t len{strlen(dirent->d_name)};
        if(len <= extlen) continue;
        if(al::strcasecmp(dirent->d_name+len-extlen, ext) != 0)
            continue;

        results->emplace_back();
        std::string &str = results->back();
        str = path;
        if(str.back() != '/')
            str.push_back('/');
        str += dirent->d_name;
    }
    closedir(dir);

    const al::span<std::string> newlist{results->data()+base, results->size()-base};
    std::sort(newlist.begin(), newlist.end());
    for(const auto &name : newlist)
        TRACE(" got %s\n", name.c_str());
}